

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O0

bool __thiscall
ON_Arc::GetNurbFormParameterFromRadian(ON_Arc *this,double RadianParameter,double *NurbParameter)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ON_3dPoint *pOVar5;
  ON_Plane *pOVar6;
  ON_3dVector *pOVar7;
  double dVar8;
  double dVar9;
  bool local_431;
  double tbez2;
  double tbez;
  double squared;
  double descrim;
  double dStack_2f8;
  int i;
  double a [3];
  ON_Plane local_2d8;
  undefined1 local_258 [8];
  ON_Xform COC;
  ON_BezierCurve bez;
  ON_Interval BezDomain;
  double at2;
  ON_3dVector local_188;
  ON_3dPoint local_170;
  ON_3dVector local_158;
  double local_140;
  double at;
  double local_120;
  double y;
  double local_100;
  double x;
  ON_3dVector local_e0;
  undefined1 local_c8 [8];
  ON_3dPoint cp;
  double ang;
  int local_a0;
  int ki;
  int si;
  int cnt;
  undefined1 local_88 [8];
  ON_NurbsCurve crv;
  double del;
  double endtol;
  ON_Interval ADomain;
  double *NurbParameter_local;
  double RadianParameter_local;
  ON_Arc *this_local;
  
  ADomain.m_t[1] = (double)NurbParameter;
  bVar1 = IsValid(this);
  if ((bVar1) && (ADomain.m_t[1] != 0.0)) {
    _endtol = DomainRadians(this);
    pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,0);
    dVar8 = *pdVar4;
    pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,1);
    dVar8 = (ABS(dVar8) + ABS(*pdVar4)) * 2.220446049250313e-15;
    pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,0);
    crv.m_cv = (double *)(RadianParameter - *pdVar4);
    if ((dVar8 < (double)crv.m_cv) || ((double)crv.m_cv < -1.490116119385e-08)) {
      pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,1);
      crv.m_cv = (double *)(*pdVar4 - RadianParameter);
      if ((dVar8 < (double)crv.m_cv) || ((double)crv.m_cv < -1.490116119385e-08)) {
        bVar1 = ON_Interval::Includes((ON_Interval *)&endtol,RadianParameter,false);
        if (bVar1) {
          ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_88);
          iVar2 = GetNurbForm(this,(ON_NurbsCurve *)local_88);
          if (iVar2 == 0) {
            this_local._7_1_ = false;
          }
          else {
            iVar2 = ON_NurbsCurve::SpanCount((ON_NurbsCurve *)local_88);
            pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,0);
            cp.z = *pdVar4;
            dVar8 = ON_NurbsCurve::Knot((ON_NurbsCurve *)local_88,0);
            ON_Curve::PointAt((ON_3dPoint *)&x,(ON_Curve *)local_88,dVar8);
            pOVar5 = ON_Circle::Center(&this->super_ON_Circle);
            ON_3dPoint::operator-(&local_e0,(ON_3dPoint *)&x,pOVar5);
            ON_3dPoint::operator=((ON_3dPoint *)local_c8,&local_e0);
            pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
            pOVar7 = ON_Plane::Xaxis(pOVar6);
            ON_3dVector::ON_3dVector((ON_3dVector *)&y,(ON_3dPoint *)local_c8);
            local_100 = ON_DotProduct(pOVar7,(ON_3dVector *)&y);
            pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
            pOVar7 = ON_Plane::Yaxis(pOVar6);
            ON_3dVector::ON_3dVector((ON_3dVector *)&at,(ON_3dPoint *)local_c8);
            local_120 = ON_DotProduct(pOVar7,(ON_3dVector *)&at);
            local_140 = atan2(local_120,local_100);
            local_a0 = 0;
            ang._4_4_ = 0;
            while (local_a0 < iVar2) {
              dVar8 = ON_NurbsCurve::Knot((ON_NurbsCurve *)local_88,ang._4_4_ + 2);
              ON_Curve::PointAt(&local_170,(ON_Curve *)local_88,dVar8);
              pOVar5 = ON_Circle::Center(&this->super_ON_Circle);
              ON_3dPoint::operator-(&local_158,&local_170,pOVar5);
              ON_3dPoint::operator=((ON_3dPoint *)local_c8,&local_158);
              pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
              pOVar7 = ON_Plane::Xaxis(pOVar6);
              ON_3dVector::ON_3dVector(&local_188,(ON_3dPoint *)local_c8);
              local_100 = ON_DotProduct(pOVar7,&local_188);
              pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
              pOVar7 = ON_Plane::Yaxis(pOVar6);
              ON_3dVector::ON_3dVector((ON_3dVector *)&at2,(ON_3dPoint *)local_c8);
              local_120 = ON_DotProduct(pOVar7,(ON_3dVector *)&at2);
              dVar9 = atan2(local_120,local_100);
              dVar8 = dVar9;
              if (dVar9 <= local_140) {
                dVar8 = dVar9 + 6.283185307179586;
              }
              cp.z = (dVar8 - local_140) + cp.z;
              local_140 = dVar9;
              if (RadianParameter < cp.z) break;
              local_a0 = local_a0 + 1;
              iVar3 = ON_NurbsCurve::KnotMultiplicity((ON_NurbsCurve *)local_88,ang._4_4_);
              ang._4_4_ = iVar3 + ang._4_4_;
            }
            iVar2 = ON_NurbsCurve::KnotCount((ON_NurbsCurve *)local_88);
            if (ang._4_4_ + 2 < iVar2) {
              dVar8 = ON_NurbsCurve::Knot((ON_NurbsCurve *)local_88,ang._4_4_);
              dVar9 = ON_NurbsCurve::Knot((ON_NurbsCurve *)local_88,ang._4_4_ + 2);
              ON_Interval::ON_Interval((ON_Interval *)&bez.m_cv_capacity,dVar8,dVar9);
              ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)(COC.m_xform[3] + 3));
              bVar1 = ON_NurbsCurve::ConvertSpanToBezier
                                ((ON_NurbsCurve *)local_88,ang._4_4_,
                                 (ON_BezierCurve *)(COC.m_xform[3] + 3));
              if (bVar1) {
                ON_Xform::ON_Xform((ON_Xform *)local_258);
                ON_Plane::ON_Plane(&local_2d8);
                pOVar6 = ON_Circle::Plane(&this->super_ON_Circle);
                ON_Xform::ChangeBasis((ON_Xform *)local_258,&local_2d8,pOVar6);
                ON_Plane::~ON_Plane(&local_2d8);
                ON_BezierCurve::Transform
                          ((ON_BezierCurve *)(COC.m_xform[3] + 3),(ON_Xform *)local_258);
                for (descrim._4_4_ = 0; descrim._4_4_ < 3; descrim._4_4_ = descrim._4_4_ + 1) {
                  dVar9 = tan(RadianParameter);
                  pdVar4 = ON_BezierCurve::CV((ON_BezierCurve *)(COC.m_xform[3] + 3),descrim._4_4_);
                  dVar8 = *pdVar4;
                  pdVar4 = ON_BezierCurve::CV((ON_BezierCurve *)(COC.m_xform[3] + 3),descrim._4_4_);
                  *(double *)((long)&stack0xfffffffffffffd08 + (long)descrim._4_4_ * 8) =
                       dVar9 * dVar8 + -pdVar4[1];
                }
                dVar8 = a[0] * a[0] + -(dStack_2f8 * a[1]);
                if (ABS((dStack_2f8 - (a[0] + a[0])) + a[1]) <= 2.3283064365386963e-10) {
                  tbez2 = 1.0;
                  if ((dStack_2f8 - a[1] != 0.0) || (NAN(dStack_2f8 - a[1]))) {
                    tbez2 = dStack_2f8 / (dStack_2f8 - a[1]);
                  }
                }
                else {
                  ON_REMOVE_ASAP_AssertEx
                            ((uint)(0.0 <= dVar8),
                             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_arccurve.cpp"
                             ,0x42d,"","descrim>=0 is false");
                  dVar8 = sqrt(dVar8);
                  tbez2 = ((dStack_2f8 - a[0]) + dVar8) / ((dStack_2f8 - (a[0] + a[0])) + a[1]);
                  if (((tbez2 < 0.0) || (1.0 < tbez2)) &&
                     (dVar8 = ((dStack_2f8 - a[0]) - dVar8) / ((dStack_2f8 - (a[0] + a[0])) + a[1]),
                     ABS(dVar8 - 0.5) < ABS(tbez2 - 0.5))) {
                    tbez2 = dVar8;
                  }
                  local_431 = -2.3283064365386963e-10 <= tbez2 && tbez2 <= 1.0000000002328306;
                  ON_REMOVE_ASAP_AssertEx
                            (local_431,
                             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_arccurve.cpp"
                             ,0x436,"",
                             "tbez>=-ON_ZERO_TOLERANCE && tbez<=1+ON_ZERO_TOLERANCE is false");
                }
                if (0.0 <= tbez2) {
                  if (1.0 < tbez2) {
                    tbez2 = 1.0;
                  }
                }
                else {
                  tbez2 = 0.0;
                }
                dVar8 = ON_Interval::ParameterAt((ON_Interval *)&bez.m_cv_capacity,tbez2);
                *(double *)ADomain.m_t[1] = dVar8;
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
              ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)(COC.m_xform[3] + 3));
            }
            else {
              pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,1);
              *(double *)ADomain.m_t[1] = *pdVar4;
              this_local._7_1_ = true;
            }
          }
          ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_88);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,1);
        *(double *)ADomain.m_t[1] = *pdVar4;
        this_local._7_1_ = true;
      }
    }
    else {
      pdVar4 = ON_Interval::operator[]((ON_Interval *)&endtol,0);
      *(double *)ADomain.m_t[1] = *pdVar4;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Arc::GetNurbFormParameterFromRadian(double RadianParameter, double* NurbParameter ) const
{
	if(!IsValid() || NurbParameter==nullptr) 
		return false;

  ON_Interval ADomain = DomainRadians();

  double endtol = 10.0*ON_EPSILON*(fabs(ADomain[0]) + fabs(ADomain[1]));

  double del = RadianParameter - ADomain[0];
	if(del <= endtol && del >= -ON_SQRT_EPSILON)
  {
		*NurbParameter=ADomain[0];
		return true;
	} 
  else {
    del = ADomain[1] - RadianParameter;
    if(del <= endtol && del >= -ON_SQRT_EPSILON){
		  *NurbParameter=ADomain[1];
		  return true;
    }
	}

	if( !ADomain.Includes(RadianParameter ) )
		return false;


	ON_NurbsCurve crv;

	if( !GetNurbForm(crv))
		return false;

	//Isolate a bezier that contains the solution
	int cnt = crv.SpanCount();	
	int si =0;	//get span index
	int ki=0;		//knot index
	double ang = ADomain[0];
	ON_3dPoint cp;
	cp = crv.PointAt( crv.Knot(0) ) - Center();
	double x = ON_DotProduct(Plane().Xaxis(),cp);
	double y = ON_DotProduct(Plane().Yaxis(),cp);
	double at = atan2( y, x);	//todo make sure we dont go to far

	for( si=0, ki=0; si<cnt; si++, ki+=crv.KnotMultiplicity(ki) ){
		cp = crv.PointAt( crv.Knot(ki+2)) - Center();
		x = ON_DotProduct(Plane().Xaxis(),cp);
		y = ON_DotProduct(Plane().Yaxis(),cp);
		double at2 = atan2(y,x);
		if(at2>at)
			ang+=(at2-at);
		else
			ang += (2*ON_PI + at2 - at);
		at = at2;
		if( ang>RadianParameter)
			break;
	} 

	// Crash Protection trr#55679
	if( ki+2>= crv.KnotCount())
	{
		 *NurbParameter=ADomain[1];
		 return true;		
	}
	ON_Interval BezDomain(crv.Knot(ki), crv.Knot(ki+2));

	ON_BezierCurve bez;
	if(!crv.ConvertSpanToBezier(ki,bez))
		return false;

 	ON_Xform COC;
	COC.ChangeBasis( ON_Plane(),Plane());   

	
	bez.Transform(COC);	// change coordinates to circles local frame
	double a[3];							// Bez coefficients of a quadratic to solve
	for(int i=0; i<3; i++)
		a[i] = tan(RadianParameter)* bez.CV(i)[0] - bez.CV(i)[1];

	//Solve the Quadratic
	double descrim = (a[1]*a[1]) - a[0]*a[2];
	double squared = a[0]-2*a[1]+a[2];
	double tbez;
	if(fabs(squared)> ON_ZERO_TOLERANCE){
		ON_ASSERT(descrim>=0);
		descrim = sqrt(descrim);
		tbez = (a[0]-a[1] + descrim)/(a[0]-2*a[1]+a[2]);
		if( tbez<0 || tbez>1){
			double tbez2 = (a[0]-a[1]-descrim)/(a[0] - 2*a[1] + a[2]);
			if( fabs(tbez2 - .5)<fabs(tbez-.5) )
				tbez = tbez2;
		}

		ON_ASSERT(tbez>=-ON_ZERO_TOLERANCE && tbez<=1+ON_ZERO_TOLERANCE);
	}
	else{
		// Quadratic degenerates to linear
		tbez = 1.0;
		if(a[0]-a[2])
			tbez = a[0]/(a[0]-a[2]);
	}	
	if(tbez<0)
		tbez=0.0;
	else if(tbez>1.0)
		tbez=1.0;


		//Debug ONLY Code  - check the result
//		double aa = a[0]*(1-tbez)*(1-tbez)  + 2*a[1]*tbez*(1-tbez) + a[2]*tbez*tbez;
//		double tantheta= tan(RadianParameter);
//		ON_3dPoint bezp;
//		bez.Evaluate(tbez, 0, 3, bezp);
//		double yx = bezp.y/bezp.x;


	*NurbParameter = BezDomain.ParameterAt(tbez);
	return true;

}